

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

uint8_t * google::protobuf::internal::InternalSerializeMapEntry
                    (FieldDescriptor *field,MapKey *key,MapValueConstRef *value,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  FieldDescriptor *field_00;
  bool bVar1;
  int32_t iVar2;
  uint uVar3;
  uint32_t uVar4;
  int cached_size;
  uint uVar5;
  Descriptor *pDVar6;
  MapKey *pMVar7;
  MapValueConstRef *pMVar8;
  size_t __n;
  MessageLite *pMVar9;
  uint64_t uVar10;
  int64_t iVar11;
  ulong uVar12;
  undefined1 *extraout_RAX;
  undefined1 *puVar13;
  uint8_t *puVar14;
  undefined1 *puVar15;
  ulong uVar16;
  uint8_t *puVar17;
  FieldDescriptor *unaff_RBX;
  byte *pbVar18;
  byte *pbVar19;
  float fVar20;
  double dVar21;
  string_view s;
  MapValueConstRef *local_58;
  FieldDescriptor *local_50;
  FieldDescriptor *local_48;
  
  puVar14 = target;
  pDVar6 = FieldDescriptor::message_type(field);
  if (pDVar6->field_count_ < 1) {
    InternalSerializeMapEntry();
    puVar13 = extraout_RAX;
LAB_0030fc49:
    puVar17 = (uint8_t *)((ulong)puVar14 & 0xffffffff);
    do {
      uVar5 = (uint)puVar14;
      *target = (byte)puVar14 | 0x80;
      puVar14 = (uint8_t *)((ulong)puVar17 >> 7);
      target = target + 1;
      puVar17 = puVar14;
    } while (0x3fff < uVar5);
  }
  else {
    field_00 = pDVar6->fields_;
    pDVar6 = FieldDescriptor::message_type(field);
    if (pDVar6->field_count_ < 2) {
      InternalSerializeMapEntry();
      unaff_RBX = field_00;
      pMVar8 = value;
LAB_0030fc95:
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    else {
      local_48 = pDVar6->fields_;
      pMVar7 = (MapKey *)MapKeyDataOnlyByteSize(field_00,key);
      pMVar8 = (MapValueConstRef *)
               MapValueRefDataOnlyByteSize((FieldDescriptor *)(ulong)local_48[1].type_,value);
      unaff_RBX = (FieldDescriptor *)key;
      key = pMVar7;
      local_58 = value;
      local_50 = field_00;
      if (stream->end_ <= target) goto LAB_0030fc95;
    }
    puVar13 = (undefined1 *)((long)&pMVar8->data_ + (long)((long)&key->val_ + 2));
    uVar5 = field->number_ * 8 + 2;
    puVar14 = (uint8_t *)(ulong)uVar5;
    if (0x7f < (uint)(field->number_ << 3)) goto LAB_0030fc49;
    puVar14 = (uint8_t *)(ulong)uVar5;
  }
  *target = (byte)puVar14;
  pbVar18 = target + 1;
  if ((uint)puVar13 < 0x80) {
    puVar13 = (undefined1 *)((ulong)puVar13 & 0xffffffff);
  }
  else {
    puVar15 = (undefined1 *)((ulong)puVar13 & 0xffffffff);
    do {
      uVar5 = (uint)puVar13;
      *pbVar18 = (byte)puVar13 | 0x80;
      puVar13 = (undefined1 *)((ulong)puVar15 >> 7);
      pbVar18 = pbVar18 + 1;
      puVar15 = puVar13;
    } while (0x3fff < uVar5);
  }
  *pbVar18 = (byte)puVar13;
  pbVar18 = SerializeMapKeyWithCachedSizes(local_50,(MapKey *)unaff_RBX,pbVar18 + 1,stream);
  if (stream->end_ <= pbVar18) {
    pbVar18 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar18);
  }
  switch(local_48[1].type_) {
  case '\x01':
    dVar21 = MapValueConstRef::GetDoubleValue(local_58);
    *pbVar18 = 0x11;
    *(double *)(pbVar18 + 1) = dVar21;
    goto LAB_0030fbec;
  case '\x02':
    fVar20 = MapValueConstRef::GetFloatValue(local_58);
    *pbVar18 = 0x15;
    *(float *)(pbVar18 + 1) = fVar20;
    goto LAB_0030fc29;
  case '\x03':
    uVar12 = MapValueConstRef::GetInt64Value(local_58);
    *pbVar18 = 0x10;
    pbVar19 = pbVar18 + 1;
    uVar16 = uVar12;
    if (uVar12 < 0x80) {
LAB_0030fbac:
      pbVar19 = pbVar18 + 1;
    }
    else {
      do {
        *pbVar19 = (byte)uVar16 | 0x80;
        uVar12 = uVar16 >> 7;
        pbVar19 = pbVar19 + 1;
        bVar1 = 0x3fff < uVar16;
        uVar16 = uVar12;
      } while (bVar1);
    }
    goto LAB_0030fbaf;
  case '\x04':
    uVar12 = MapValueConstRef::GetUInt64Value(local_58);
    *pbVar18 = 0x10;
    pbVar19 = pbVar18 + 1;
    uVar10 = uVar12;
    if (uVar12 < 0x80) goto LAB_0030fbac;
    do {
      *pbVar19 = (byte)uVar10 | 0x80;
      uVar12 = uVar10 >> 7;
      pbVar19 = pbVar19 + 1;
      bVar1 = 0x3fff < uVar10;
      uVar10 = uVar12;
    } while (bVar1);
    goto LAB_0030fbaf;
  case '\x05':
    uVar5 = MapValueConstRef::GetInt32Value(local_58);
    *pbVar18 = 0x10;
    pbVar19 = pbVar18 + 1;
    uVar12 = (ulong)(int)uVar5;
    uVar16 = uVar12;
    if (uVar5 < 0x80) {
LAB_0030fbd1:
      pbVar19 = pbVar18 + 1;
    }
    else {
      do {
        *pbVar19 = (byte)uVar16 | 0x80;
        uVar12 = uVar16 >> 7;
        pbVar19 = pbVar19 + 1;
        bVar1 = 0x3fff < uVar16;
        uVar16 = uVar12;
      } while (bVar1);
    }
    goto LAB_0030fbd4;
  case '\x06':
    uVar10 = MapValueConstRef::GetUInt64Value(local_58);
    goto LAB_0030fbe2;
  case '\a':
    uVar4 = MapValueConstRef::GetUInt32Value(local_58);
    goto LAB_0030fc1f;
  case '\b':
    bVar1 = MapValueConstRef::GetBoolValue(local_58);
    *pbVar18 = 0x10;
    pbVar18[1] = bVar1;
    pbVar18 = pbVar18 + 2;
    break;
  case '\t':
  case '\f':
    s = MapValueConstRef::GetStringValue(local_58);
    __n = s._M_len;
    if ((0x7f < (long)__n) || ((long)(stream->end_ + (0xe - (long)pbVar18)) < (long)__n)) {
      puVar14 = io::EpsCopyOutputStream::WriteStringOutline(stream,2,s,pbVar18);
      return puVar14;
    }
    *pbVar18 = 0x12;
    pbVar18[1] = (byte)s._M_len;
    memcpy(pbVar18 + 2,s._M_str,__n);
    pbVar18 = pbVar18 + __n + 2;
    break;
  case '\n':
    pMVar9 = &MapValueConstRef::GetMessageValue(local_58)->super_MessageLite;
    puVar14 = WireFormatLite::InternalWriteGroup(2,pMVar9,pbVar18,stream);
    return puVar14;
  case '\v':
    pMVar9 = &MapValueConstRef::GetMessageValue(local_58)->super_MessageLite;
    cached_size = MessageLite::GetCachedSize(pMVar9);
    puVar14 = WireFormatLite::InternalWriteMessage(2,pMVar9,cached_size,pbVar18,stream);
    return puVar14;
  case '\r':
    uVar3 = MapValueConstRef::GetUInt32Value(local_58);
    *pbVar18 = 0x10;
    pbVar19 = pbVar18 + 1;
    uVar4 = uVar3;
    if (0x7f < uVar3) {
      do {
        *pbVar19 = (byte)uVar4 | 0x80;
        uVar3 = uVar4 >> 7;
        pbVar19 = pbVar19 + 1;
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar3;
      } while (bVar1);
    }
    goto LAB_0030fa7d;
  case '\x0e':
    uVar5 = MapValueConstRef::GetEnumValue(local_58);
    *pbVar18 = 0x10;
    pbVar19 = pbVar18 + 1;
    uVar12 = (ulong)(int)uVar5;
    uVar16 = uVar12;
    if (uVar5 < 0x80) goto LAB_0030fbd1;
    do {
      *pbVar19 = (byte)uVar16 | 0x80;
      uVar12 = uVar16 >> 7;
      pbVar19 = pbVar19 + 1;
      bVar1 = 0x3fff < uVar16;
      uVar16 = uVar12;
    } while (bVar1);
LAB_0030fbd4:
    *pbVar19 = (byte)uVar12;
    goto LAB_0030fbd8;
  case '\x0f':
    uVar4 = MapValueConstRef::GetInt32Value(local_58);
LAB_0030fc1f:
    *pbVar18 = 0x15;
    *(uint32_t *)(pbVar18 + 1) = uVar4;
LAB_0030fc29:
    pbVar18 = pbVar18 + 5;
    break;
  case '\x10':
    uVar10 = MapValueConstRef::GetInt64Value(local_58);
LAB_0030fbe2:
    *pbVar18 = 0x11;
    *(uint64_t *)(pbVar18 + 1) = uVar10;
LAB_0030fbec:
    pbVar18 = pbVar18 + 9;
    break;
  case '\x11':
    iVar2 = MapValueConstRef::GetInt32Value(local_58);
    *pbVar18 = 0x10;
    pbVar19 = pbVar18 + 1;
    uVar3 = iVar2 >> 0x1f ^ iVar2 * 2;
    uVar5 = uVar3;
    if (0x7f < uVar3) {
      do {
        *pbVar19 = (byte)uVar5 | 0x80;
        uVar3 = uVar5 >> 7;
        pbVar19 = pbVar19 + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar3;
      } while (bVar1);
    }
LAB_0030fa7d:
    *pbVar19 = (byte)uVar3;
    goto LAB_0030fbd8;
  case '\x12':
    iVar11 = MapValueConstRef::GetInt64Value(local_58);
    *pbVar18 = 0x10;
    pbVar19 = pbVar18 + 1;
    uVar12 = iVar11 >> 0x3f ^ iVar11 * 2;
    uVar16 = uVar12;
    if (uVar12 < 0x80) goto LAB_0030fbac;
    do {
      *pbVar19 = (byte)uVar16 | 0x80;
      uVar12 = uVar16 >> 7;
      pbVar19 = pbVar19 + 1;
      bVar1 = 0x3fff < uVar16;
      uVar16 = uVar12;
    } while (bVar1);
LAB_0030fbaf:
    *pbVar19 = (byte)uVar12;
LAB_0030fbd8:
    pbVar18 = pbVar19 + 1;
  }
  return pbVar18;
}

Assistant:

static uint8_t* InternalSerializeMapEntry(const FieldDescriptor* field,
                                          const MapKey& key,
                                          const MapValueConstRef& value,
                                          uint8_t* target,
                                          io::EpsCopyOutputStream* stream) {
  const FieldDescriptor* key_field = field->message_type()->field(0);
  const FieldDescriptor* value_field = field->message_type()->field(1);

  size_t size = kMapEntryTagByteSize;
  size += MapKeyDataOnlyByteSize(key_field, key);
  size += MapValueRefDataOnlyByteSize(value_field, value);
  target = stream->EnsureSpace(target);
  target = WireFormatLite::WriteTagToArray(
      field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
  target = io::CodedOutputStream::WriteVarint32ToArray(size, target);
  target = SerializeMapKeyWithCachedSizes(key_field, key, target, stream);
  target =
      SerializeMapValueRefWithCachedSizes(value_field, value, target, stream);
  return target;
}